

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  undefined1 value [16];
  anon_class_40_4_2c7d0318 add_thousands_sep;
  char *pcVar1;
  size_t __n;
  char *__dest;
  int digit_index;
  const_iterator group;
  undefined4 in_stack_ffffffffffffff50;
  undefined8 local_80;
  char local_78 [88];
  
  local_80 = **(undefined8 **)(this + 0x18);
  __dest = *it;
  value._8_8_ = this + 0x20;
  value._0_8_ = this;
  add_thousands_sep.s.data_ = (char *)&local_80;
  add_thousands_sep.this = (num_writer *)0x1;
  add_thousands_sep.s.size_ = (size_t)&stack0xffffffffffffff54;
  add_thousands_sep.group._0_4_ = in_stack_ffffffffffffff50;
  add_thousands_sep.group._4_4_ = 0;
  add_thousands_sep.digit_index = (int *)this;
  pcVar1 = internal::operator()
                     (local_78,(unsigned___int128)value,(int)*(undefined8 *)this,add_thousands_sep);
  if (local_78 != pcVar1) {
    __n = (long)pcVar1 - (long)local_78;
    switchD_012e1ce8::default(__dest,local_78,__n);
    __dest = __dest + __n;
  }
  *it = __dest;
  return;
}

Assistant:

void operator()(It&& it) const {
        basic_string_view<char_type> s(&sep, sep_size);
        // Index of a decimal digit with the least significant digit having
        // index 0.
        int digit_index = 0;
        std::string::const_iterator group = groups.cbegin();
        it = format_decimal<char_type>(
            it, abs_value, size,
            [this, s, &group, &digit_index](char_type*& buffer) {
              if (*group <= 0 || ++digit_index % *group != 0 ||
                  *group == max_value<char>())
                return;
              if (group + 1 != groups.cend()) {
                digit_index = 0;
                ++group;
              }
              buffer -= s.size();
              std::uninitialized_copy(s.data(), s.data() + s.size(),
                                      make_checked(buffer, s.size()));
            });
      }